

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

FT_Error af_cjk_hints_compute_segments(AF_GlyphHints hints,AF_Dimension dim)

{
  ushort uVar1;
  ushort uVar2;
  AF_Segment_conflict pAVar3;
  FT_UInt f1;
  FT_UInt f0;
  AF_Point_conflict last;
  AF_Point_conflict pt;
  AF_Segment_conflict seg;
  FT_Error error;
  AF_Segment_conflict segment_limit;
  AF_Segment_conflict segments;
  AF_AxisHints axis;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  pt = (AF_Point_conflict)hints->axis[dim].segments;
  pAVar3 = (AF_Segment_conflict)pt + hints->axis[dim].num_segments;
  hints_local._4_4_ = af_latin_hints_compute_segments(hints,dim);
  if (hints_local._4_4_ == 0) {
    for (; pt < pAVar3; pt = pt + 1) {
      last = pt->next;
      uVar1 = last->flags;
      *(byte *)&pt->flags = (byte)pt->flags & 0xfe;
      while (uVar2 = uVar1 & 3, last != pt->prev) {
        last = last->next;
        uVar1 = last->flags;
        if ((uVar2 == 0) && ((uVar1 & 3) == 0)) break;
        if (last == pt->prev) {
          *(byte *)&pt->flags = (byte)pt->flags | 1;
        }
      }
    }
    hints_local._4_4_ = 0;
  }
  return hints_local._4_4_;
}

Assistant:

static FT_Error
  af_cjk_hints_compute_segments( AF_GlyphHints  hints,
                                 AF_Dimension   dim )
  {
    AF_AxisHints  axis          = &hints->axis[dim];
    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = segments + axis->num_segments;
    FT_Error      error;
    AF_Segment    seg;


    error = af_latin_hints_compute_segments( hints, dim );
    if ( error )
      return error;

    /* a segment is round if it doesn't have successive */
    /* on-curve points.                                 */
    for ( seg = segments; seg < segment_limit; seg++ )
    {
      AF_Point  pt   = seg->first;
      AF_Point  last = seg->last;
      FT_UInt   f0   = pt->flags & AF_FLAG_CONTROL;
      FT_UInt   f1;


      seg->flags &= ~AF_EDGE_ROUND;

      for ( ; pt != last; f0 = f1 )
      {
        pt = pt->next;
        f1 = pt->flags & AF_FLAG_CONTROL;

        if ( !f0 && !f1 )
          break;

        if ( pt == last )
          seg->flags |= AF_EDGE_ROUND;
      }
    }

    return FT_Err_Ok;
  }